

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<ProKey,_ProFunctionDef>::erase(QHash<ProKey,_ProFunctionDef> *this,const_iterator it)

{
  Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *pDVar1;
  ulong uVar2;
  Span *pSVar3;
  uint uVar4;
  iterator iVar5;
  Bucket bucket;
  
  uVar2 = it.i.bucket;
  pDVar1 = this->d;
  if ((pDVar1 == (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)0x0) ||
     (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::detached(pDVar1);
    this->d = pDVar1;
  }
  pDVar1 = this->d;
  pSVar3 = pDVar1->spans + (uVar2 >> 7);
  uVar4 = (uint)it.i.bucket & 0x7f;
  bucket.index._0_4_ = uVar4;
  bucket.span = pSVar3;
  bucket.index._4_4_ = 0;
  QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::erase(pDVar1,bucket);
  if (((((ulong)((long)pSVar3 - (long)this->d->spans) >> 4) * 0x1c71c71c71c71c80 | (ulong)uVar4) ==
       this->d->numBuckets - 1) || (pSVar3->offsets[uVar4] == 0xff)) {
    do {
      if (pDVar1->numBuckets - 1 == uVar2) {
        pDVar1 = (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)0x0;
        uVar2 = 0;
        break;
      }
      uVar2 = uVar2 + 1;
    } while (pDVar1->spans[uVar2 >> 7].offsets[(uint)uVar2 & 0x7f] == 0xff);
  }
  iVar5.i.bucket = uVar2;
  iVar5.i.d = pDVar1;
  return (iterator)iVar5.i;
}

Assistant:

iterator erase(const_iterator it)
    {
        Q_ASSERT(it != constEnd());
        detach();
        // ensure a valid iterator across the detach:
        iterator i = iterator{d->detachedIterator(it.i)};
        typename Data::Bucket bucket(i.i);

        d->erase(bucket);
        if (bucket.toBucketIndex(d) == d->numBuckets - 1 || bucket.isUnused())
            ++i;
        return i;
    }